

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O3

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,
          KNearestNeighborsClassifier *modelParameters,bool allowEmptyLabels,
          bool defaultClassLabelIsInt64)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  StringVector *pSVar4;
  Int64Vector *pIVar5;
  char cVar6;
  byte unaff_BPL;
  ModelDescription *interface;
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar2 = *(int *)((long)&model[1]._internal_metadata_.
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          .ptr_ + 4);
  cVar6 = (char)modelParameters;
  if (iVar2 == 0) {
    if (cVar6 != '\0') goto LAB_004df02a;
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Classifier models must provide class labels.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
  }
  else if (iVar2 == 100) {
    if ((cVar6 == '\0') && (((model->Type_).pipelineclassifier_)->_cached_size_ == 0)) {
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared to have String class labels must provide labels.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
    else {
      pIVar5 = Specification::Int64Vector::default_instance();
      if ((pIVar5->vector_).current_size_ == 0) {
        allowEmptyLabels = false;
        goto LAB_004df02a;
      }
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,"");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
  }
  else {
    allowEmptyLabels = (bool)unaff_BPL;
    if (iVar2 != 0x65) {
LAB_004df02a:
      interface = *(ModelDescription **)(this + 0x10);
      if (interface == (ModelDescription *)0x0) {
        interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      validateFeatureDescriptions((Result *)local_48,interface,*(int *)(this + 0x18));
      bVar3 = Result::good((Result *)local_48);
      if (!bVar3) {
        __return_storage_ptr__->m_type = local_48._0_4_;
        __return_storage_ptr__->m_reason = local_48._4_4_;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._8_8_ == &local_30) {
          paVar1->_M_allocated_capacity = local_30._0_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_30._8_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)local_48._8_8_;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity = local_30._0_8_;
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_48._16_8_;
        return __return_storage_ptr__;
      }
      validateClassifierFeatureDescriptions
                (__return_storage_ptr__,interface,(bool)(allowEmptyLabels & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._8_8_ == &local_30) {
        return __return_storage_ptr__;
      }
      goto LAB_004df131;
    }
    if ((cVar6 == '\0') &&
       ((((model->Type_).supportvectorclassifier_)->numberofsupportvectorsperclass_).current_size_
        == 0)) {
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared to have Int64 class labels must provide labels.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
    else {
      pSVar4 = Specification::StringVector::default_instance();
      if ((pSVar4->vector_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        allowEmptyLabels = true;
        goto LAB_004df02a;
      }
      local_48._0_8_ = local_48 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,
                 "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                 ,"");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_48);
    }
  }
  local_30._M_allocated_capacity = local_48._16_8_;
  local_48._8_8_ = local_48._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_48 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_004df131:
  operator_delete((void *)local_48._8_8_,local_30._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false) {
        
        bool expected_class_is_int64;
        
        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }
                
                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }
                
                expected_class_is_int64 = true;
                
                break;
                
            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }
                
                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }
                
                expected_class_is_int64 = false;
                
                break;
                
            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();
        
            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion());
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }